

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

mat4 * __thiscall Camera::GetViewMatrix(mat4 *__return_storage_ptr__,Camera *this)

{
  vec<3,_float,_(glm::qualifier)0> *in_R8;
  vec<3,_float,_(glm::qualifier)0> vVar1;
  vec<3,_float,_(glm::qualifier)0> local_30;
  vec<3,_float,_(glm::qualifier)0> local_1c;
  Camera *local_10;
  Camera *this_local;
  
  local_10 = this;
  vVar1 = glm::operator+(&this->Position,&this->Front);
  local_30._0_8_ = vVar1._0_8_;
  local_1c.field_0 = local_30.field_0;
  local_1c.field_1 = local_30.field_1;
  local_30.field_2 = vVar1.field_2;
  local_1c.field_2 = local_30.field_2;
  glm::lookAt<float,(glm::qualifier)0>(__return_storage_ptr__,(glm *)this,&local_1c,&this->Up,in_R8)
  ;
  return __return_storage_ptr__;
}

Assistant:

glm::mat4 GetViewMatrix() const {
        return glm::lookAt(this->Position, this->Position + this->Front, this->Up);
    }